

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManCollect_rec(If_DsdMan_t *p,int Id,Vec_Int_t *vNodes,Vec_Int_t *vFirsts,int *pnSupp)

{
  int Entry;
  uint uVar1;
  int iVar2;
  If_DsdObj_t *pObj;
  uint i;
  
  pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,Id);
  uVar1 = *(uint *)&pObj->field_0x4;
  if ((uVar1 & 7) != 1) {
    if ((uVar1 & 7) != 2) {
      Entry = *pnSupp;
      for (i = 0; i < uVar1 >> 0x1b; i = i + 1) {
        iVar2 = If_DsdObjFaninLit(pObj,i);
        if (iVar2 == 0) break;
        iVar2 = Abc_Lit2Var(iVar2);
        If_DsdManCollect_rec(p,iVar2,vNodes,vFirsts,pnSupp);
        uVar1 = *(uint *)&pObj->field_0x4;
      }
      Vec_IntPush(vNodes,Id);
      Vec_IntPush(vFirsts,Entry);
      return;
    }
    *pnSupp = *pnSupp + 1;
  }
  return;
}

Assistant:

void If_DsdManCollect_rec( If_DsdMan_t * p, int Id, Vec_Int_t * vNodes, Vec_Int_t * vFirsts, int * pnSupp )
{
    int i, iFanin, iFirst;
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        return;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        (*pnSupp)++;
        return;
    }
    iFirst = *pnSupp;
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        If_DsdManCollect_rec( p, Abc_Lit2Var(iFanin), vNodes, vFirsts, pnSupp );
    Vec_IntPush( vNodes, Id );
    Vec_IntPush( vFirsts, iFirst );
}